

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTable.c
# Opt level: O0

Hop_Obj_t ** Hop_TableFind(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  int iVar1;
  Hop_Obj_t **ppHVar2;
  Hop_Obj_t *pHVar3;
  unsigned_long uVar4;
  anon_union_8_2_6d2434d6_for_Hop_Obj_t__2 *local_28;
  Hop_Obj_t **ppEntry;
  Hop_Obj_t *pObj_local;
  Hop_Man_t *p_local;
  
  pHVar3 = Hop_ObjChild0(pObj);
  if ((pHVar3 == (Hop_Obj_t *)0x0) || (pHVar3 = Hop_ObjChild1(pObj), pHVar3 == (Hop_Obj_t *)0x0)) {
    __assert_fail("Hop_ObjChild0(pObj) && Hop_ObjChild1(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopTable.c"
                  ,0x2d,"Hop_Obj_t **Hop_TableFind(Hop_Man_t *, Hop_Obj_t *)");
  }
  pHVar3 = Hop_ObjFanin0(pObj);
  iVar1 = pHVar3->Id;
  pHVar3 = Hop_ObjFanin1(pObj);
  if (pHVar3->Id <= iVar1) {
    __assert_fail("Hop_ObjFanin0(pObj)->Id < Hop_ObjFanin1(pObj)->Id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopTable.c"
                  ,0x2e,"Hop_Obj_t **Hop_TableFind(Hop_Man_t *, Hop_Obj_t *)");
  }
  ppHVar2 = p->pTable;
  uVar4 = Hop_Hash(pObj,p->nTableSize);
  for (local_28 = (anon_union_8_2_6d2434d6_for_Hop_Obj_t__2 *)(ppHVar2 + uVar4);
      local_28->pNext != (Hop_Obj_t *)0x0; local_28 = &local_28->pNext->field_1) {
    if (local_28->pNext == pObj) {
      return (Hop_Obj_t **)local_28;
    }
  }
  if (local_28->pNext == (Hop_Obj_t *)0x0) {
    return (Hop_Obj_t **)local_28;
  }
  __assert_fail("*ppEntry == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopTable.c"
                ,0x32,"Hop_Obj_t **Hop_TableFind(Hop_Man_t *, Hop_Obj_t *)");
}

Assistant:

static Hop_Obj_t ** Hop_TableFind( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    Hop_Obj_t ** ppEntry;
    assert( Hop_ObjChild0(pObj) && Hop_ObjChild1(pObj) );
    assert( Hop_ObjFanin0(pObj)->Id < Hop_ObjFanin1(pObj)->Id );
    for ( ppEntry = p->pTable + Hop_Hash(pObj, p->nTableSize); *ppEntry; ppEntry = &(*ppEntry)->pNext )
        if ( *ppEntry == pObj )
            return ppEntry;
    assert( *ppEntry == NULL );
    return ppEntry;
}